

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkHaigCollectMembers(Hop_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pObj_00;
  Hop_Obj_t *pHVar2;
  int local_24;
  int i;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *vObjs;
  Hop_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(0x1002);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pObj_00->field_0).pData != (void *)0x0) {
      pHVar2 = Hop_ObjRepr(pObj_00);
      (pObj_00->field_0).pData = pHVar2;
      Vec_PtrPush(p_00,pObj_00);
    }
  }
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Collects the nodes in the classes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Abc_NtkHaigCollectMembers( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pObj;
    int i;
    vObjs = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( pObj->pData == NULL )
            continue;
        pObj->pData = Hop_ObjRepr( pObj );
        Vec_PtrPush( vObjs, pObj );
    }
    return vObjs;
}